

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O0

FT_Error bdf_list_split_(bdf_list_t_ *list,char *separators,char *line,unsigned_long linelen)

{
  unsigned_long uVar1;
  bool bVar2;
  byte *pbVar3;
  bool bVar4;
  bool local_8a;
  char *local_88;
  FT_Error local_7c;
  byte local_78 [4];
  FT_Error error;
  char seps [32];
  byte *local_50;
  char *ep;
  char *end;
  char *sp;
  long lStack_30;
  int mult;
  unsigned_long final_empty;
  unsigned_long linelen_local;
  char *line_local;
  char *separators_local;
  bdf_list_t_ *list_local;
  
  local_7c = 0;
  list->used = 0;
  if (list->size != 0) {
    *list->field = "";
    list->field[1] = "";
    list->field[2] = "";
    list->field[3] = "";
    list->field[4] = "";
  }
  if ((linelen != 0) && (*line != '\0')) {
    if ((separators == (char *)0x0) || (*separators == '\0')) {
      local_7c = 6;
    }
    else {
      memset(local_78,0,0x20);
      bVar2 = false;
      end = separators;
      while( true ) {
        bVar4 = false;
        if (end != (char *)0x0) {
          bVar4 = *end != '\0';
        }
        if (!bVar4) break;
        if ((*end == '+') && (end[1] == '\0')) {
          bVar2 = true;
        }
        else {
          local_78[(int)(uint)(byte)*end >> 3] =
               local_78[(int)(uint)(byte)*end >> 3] | (byte)(1 << (*end & 7U));
        }
        end = end + 1;
      }
      lStack_30 = 0;
      end = line;
      while( true ) {
        bVar4 = false;
        if (end < line + linelen) {
          bVar4 = *end != '\0';
        }
        local_50 = (byte *)end;
        if (!bVar4) break;
        while( true ) {
          pbVar3 = local_50;
          bVar4 = false;
          if (*local_50 != 0) {
            bVar4 = ((int)(char)local_78[(int)(uint)*local_50 >> 3] & 1 << (*local_50 & 7)) == 0;
          }
          if (!bVar4) break;
          local_50 = local_50 + 1;
        }
        if ((list->used == list->size) &&
           (local_7c = bdf_list_ensure_(list,list->used + 1), local_7c != 0)) {
          return local_7c;
        }
        if (end < local_50) {
          local_88 = end;
        }
        else {
          local_88 = "";
        }
        uVar1 = list->used;
        list->used = uVar1 + 1;
        list->field[uVar1] = local_88;
        if (bVar2) {
          while( true ) {
            bVar4 = false;
            if (*local_50 != 0) {
              bVar4 = ((int)(char)local_78[(int)(uint)*local_50 >> 3] & 1 << (*local_50 & 7)) != 0;
            }
            if (!bVar4) break;
            *local_50 = 0;
            local_50 = local_50 + 1;
          }
        }
        else if (*local_50 != 0) {
          *local_50 = 0;
          local_50 = local_50 + 1;
        }
        local_8a = false;
        if (pbVar3 < local_50) {
          local_8a = *local_50 == 0;
        }
        lStack_30 = (long)(int)(uint)local_8a;
        end = (char *)local_50;
      }
      if ((list->used + lStack_30 < list->size) ||
         (local_7c = bdf_list_ensure_(list,list->used + lStack_30 + 1), local_7c == 0)) {
        if (lStack_30 != 0) {
          uVar1 = list->used;
          list->used = uVar1 + 1;
          list->field[uVar1] = "";
        }
        list->field[list->used] = (char *)0x0;
      }
    }
  }
  return local_7c;
}

Assistant:

static FT_Error
  bdf_list_split_( bdf_list_t_*   list,
                   const char*    separators,
                   char*          line,
                   unsigned long  linelen )
  {
    unsigned long  final_empty;
    int            mult;
    const char     *sp, *end;
    char           *ep;
    char           seps[32];
    FT_Error       error = FT_Err_Ok;


    /* Initialize the list. */
    list->used = 0;
    if ( list->size )
    {
      list->field[0] = (char*)empty;
      list->field[1] = (char*)empty;
      list->field[2] = (char*)empty;
      list->field[3] = (char*)empty;
      list->field[4] = (char*)empty;
    }

    /* If the line is empty, then simply return. */
    if ( linelen == 0 || line[0] == 0 )
      goto Exit;

    /* In the original code, if the `separators' parameter is NULL or */
    /* empty, the list is split into individual bytes.  We don't need */
    /* this, so an error is signaled.                                 */
    if ( separators == NULL || *separators == 0 )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Prepare the separator bitmap. */
    FT_MEM_ZERO( seps, 32 );

    /* If the very last character of the separator string is a plus, then */
    /* set the `mult' flag to indicate that multiple separators should be */
    /* collapsed into one.                                                */
    for ( mult = 0, sp = separators; sp && *sp; sp++ )
    {
      if ( *sp == '+' && *( sp + 1 ) == 0 )
        mult = 1;
      else
        setsbit( seps, *sp );
    }

    /* Break the line up into fields. */
    for ( final_empty = 0, sp = ep = line, end = sp + linelen;
          sp < end && *sp; )
    {
      /* Collect everything that is not a separator. */
      for ( ; *ep && !sbitset( seps, *ep ); ep++ )
        ;

      /* Resize the list if necessary. */
      if ( list->used == list->size )
      {
        error = bdf_list_ensure_( list, list->used + 1 );
        if ( error )
          goto Exit;
      }

      /* Assign the field appropriately. */
      list->field[list->used++] = ( ep > sp ) ? (char*)sp : (char*)empty;

      sp = ep;

      if ( mult )
      {
        /* If multiple separators should be collapsed, do it now by */
        /* setting all the separator characters to 0.               */
        for ( ; *ep && sbitset( seps, *ep ); ep++ )
          *ep = 0;
      }
      else if ( *ep != 0 )
        /* Don't collapse multiple separators by making them 0, so just */
        /* make the one encountered 0.                                  */
        *ep++ = 0;

      final_empty = ( ep > sp && *ep == 0 );
      sp = ep;
    }

    /* Finally, NULL-terminate the list. */
    if ( list->used + final_empty >= list->size )
    {
      error = bdf_list_ensure_( list, list->used + final_empty + 1 );
      if ( error )
        goto Exit;
    }

    if ( final_empty )
      list->field[list->used++] = (char*)empty;

    list->field[list->used] = NULL;

  Exit:
    return error;
  }